

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,true>
               (uhugeint_t *ldata,uhugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  uhugeint_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uhugeint_t *local_a0;
  uhugeint_t local_88;
  uhugeint_t local_78;
  ulong local_60;
  uint64_t local_58;
  uint64_t uStack_50;
  ulong local_40;
  ValidityMask *local_38;
  
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_58 = rdata->lower;
      uStack_50 = rdata->upper;
      iVar5 = 0;
      local_a0 = ldata;
      do {
        local_78.lower = local_a0->lower;
        local_78.upper = local_a0->upper;
        local_88.lower = local_58;
        local_88.upper = uStack_50;
        bVar2 = uhugeint_t::operator==(&local_78,&local_88);
        result_data[iVar5] = !bVar2;
        iVar5 = iVar5 + 1;
        local_a0 = local_a0 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    uVar7 = 0;
    uVar4 = 0;
    local_40 = count;
    do {
      puVar1 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[uVar7];
      }
      uVar10 = uVar4 + 0x40;
      if (local_40 <= uVar4 + 0x40) {
        uVar10 = local_40;
      }
      uVar3 = uVar10;
      if (uVar6 != 0) {
        uVar3 = uVar4;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar4 < uVar10) {
            local_58 = rdata->lower;
            uStack_50 = rdata->upper;
            puVar8 = ldata + uVar4;
            do {
              local_78.lower = puVar8->lower;
              local_78.upper = puVar8->upper;
              local_88.lower = local_58;
              local_88.upper = uStack_50;
              bVar2 = uhugeint_t::operator==(&local_78,&local_88);
              result_data[uVar3] = !bVar2;
              uVar3 = uVar3 + 1;
              puVar8 = puVar8 + 1;
            } while (uVar10 != uVar3);
          }
        }
        else if (uVar4 < uVar10) {
          puVar8 = ldata + uVar4;
          uVar9 = 0;
          do {
            if ((uVar6 >> (uVar9 & 0x3f) & 1) != 0) {
              local_78.lower = puVar8->lower;
              local_78.upper = puVar8->upper;
              local_88.lower = rdata->lower;
              local_88.upper = rdata->upper;
              bVar2 = uhugeint_t::operator==(&local_78,&local_88);
              result_data[uVar4] = !bVar2;
            }
            uVar4 = uVar4 + 1;
            puVar8 = puVar8 + 1;
            uVar9 = uVar9 + 1;
            uVar3 = uVar4;
          } while (uVar10 != uVar4);
        }
      }
      uVar7 = uVar7 + 1;
      uVar4 = uVar3;
    } while (uVar7 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}